

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalIndexManager.hpp
# Opt level: O2

void __thiscall OpenMD::LocalIndexManager::~LocalIndexManager(LocalIndexManager *this)

{
  std::__cxx11::_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_clear
            (&(this->inversionIndexContainer_).indexContainer_.
              super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  std::__cxx11::_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_clear
            (&(this->torsionIndexContainer_).indexContainer_.
              super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  std::__cxx11::_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_clear
            (&(this->bendIndexContainer_).indexContainer_.
              super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  std::__cxx11::_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_clear
            (&(this->bondIndexContainer_).indexContainer_.
              super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  std::__cxx11::_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_clear
            (&(this->cutoffGroupIndexContainer_).indexContainer_.
              super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  std::__cxx11::_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_clear
            (&(this->rigidBodyIndexContainer_).indexContainer_.
              super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  std::__cxx11::_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_clear
            (&(this->atomIndexContainer_).indexContainer_.
              super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  return;
}

Assistant:

int getNextAtomIndex() { return atomIndexContainer_.pop(); }